

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix3 * matrix3_translatev2(matrix3 *self,vector2 *translation)

{
  matrix3 translationMatrix;
  matrix3 local_34;
  
  matrix3_make_transformation_translationv2(&local_34,translation);
  matrix3_multiply(self,&local_34);
  return self;
}

Assistant:

HYPAPI struct matrix3 *matrix3_translatev2(struct matrix3 *self, const struct vector2 *translation)
{
	struct matrix3 translationMatrix;

	return matrix3_multiply(self,
		matrix3_make_transformation_translationv2(&translationMatrix, translation));
}